

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void AM_drawGrid(int color)

{
  AMColor *pAVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  mline_t ml;
  mline_t local_70;
  long local_50;
  double local_48;
  double local_40;
  double local_38;
  
  dVar3 = m_h * m_h + m_w * m_w;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar7 = bmaporgx;
  dVar2 = m_y;
  dVar5 = m_x;
  dVar6 = (dVar3 - m_w) * 0.5;
  local_48 = (dVar3 - m_h) * 0.5;
  local_40 = m_x - dVar6;
  dVar4 = ceil((local_40 - bmaporgx) * 0.0078125);
  dVar7 = dVar4 * 128.0 + dVar7;
  dVar6 = (dVar5 + dVar3) - dVar6;
  dVar5 = dVar2 - local_48;
  local_50 = (long)color;
  if (dVar7 < dVar6) {
    local_38 = dVar3 + dVar5;
    pAVar1 = AMColors.c + local_50;
    do {
      local_70.b.y = local_38;
      local_70.a.x = dVar7;
      local_70.a.y = dVar5;
      local_70.b.x = dVar7;
      if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
        AM_rotatePoint((double *)&local_70,&local_70.a.y);
        AM_rotatePoint(&local_70.b.x,&local_70.b.y);
      }
      AM_drawMline(&local_70,pAVar1);
      dVar7 = dVar7 + 128.0;
    } while (dVar7 < dVar6);
  }
  dVar7 = bmaporgy;
  dVar5 = ceil((dVar5 - bmaporgy) * 0.0078125);
  dVar7 = dVar5 * 128.0 + dVar7;
  dVar5 = (dVar2 + dVar3) - local_48;
  if (dVar7 < dVar5) {
    dVar3 = dVar3 + local_40;
    pAVar1 = AMColors.c + local_50;
    do {
      local_70.a.x = local_40;
      local_70.a.y = dVar7;
      local_70.b.x = dVar3;
      local_70.b.y = dVar7;
      if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
        AM_rotatePoint((double *)&local_70,&local_70.a.y);
        AM_rotatePoint(&local_70.b.x,&local_70.b.y);
      }
      AM_drawMline(&local_70,pAVar1);
      dVar7 = dVar7 + 128.0;
    } while (dVar7 < dVar5);
  }
  return;
}

Assistant:

void AM_drawGrid (int color)
{
	double x, y;
	double start, end;
	mline_t ml;
	double minlen, extx, exty;
	double minx, miny;

	// [RH] Calculate a minimum for how long the grid lines should be so that
	// they cover the screen at any rotation.
	minlen = sqrt (m_w*m_w + m_h*m_h);
	extx = (minlen - m_w) / 2;
	exty = (minlen - m_h) / 2;

	minx = m_x;
	miny = m_y;

	// Figure out start of vertical gridlines
	start = minx - extx;
	start = ceil((start - bmaporgx) / MAPBLOCKUNITS) * MAPBLOCKUNITS + bmaporgx;

	end = minx + minlen - extx;

	// draw vertical gridlines
	for (x = start; x < end; x += MAPBLOCKUNITS)
	{
		ml.a.x = x;
		ml.b.x = x;
		ml.a.y = miny - exty;
		ml.b.y = ml.a.y + minlen;
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotatePoint (&ml.a.x, &ml.a.y);
			AM_rotatePoint (&ml.b.x, &ml.b.y);
		}
		AM_drawMline(&ml, color);
	}

	// Figure out start of horizontal gridlines
	start = miny - exty;
	start = ceil((start - bmaporgy) / MAPBLOCKUNITS) * MAPBLOCKUNITS + bmaporgy;
	end = miny + minlen - exty;

	// draw horizontal gridlines
	for (y=start; y<end; y+=MAPBLOCKUNITS)
	{
		ml.a.x = minx - extx;
		ml.b.x = ml.a.x + minlen;
		ml.a.y = y;
		ml.b.y = y;
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotatePoint (&ml.a.x, &ml.a.y);
			AM_rotatePoint (&ml.b.x, &ml.b.y);
		}
		AM_drawMline (&ml, color);
	}
}